

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void cf_he_ctx_clear(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  ulong local_28;
  size_t i;
  cf_he_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    baller_free(*(eyeballer **)((long)pvVar1 + local_28 * 8 + 0x20),data);
    *(undefined8 *)((long)pvVar1 + local_28 * 8 + 0x20) = 0;
  }
  baller_free(*(eyeballer **)((long)pvVar1 + 0x30),data);
  *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  return;
}

Assistant:

static void cf_he_ctx_clear(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  DEBUGASSERT(ctx);
  DEBUGASSERT(data);
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    baller_free(ctx->baller[i], data);
    ctx->baller[i] = NULL;
  }
  baller_free(ctx->winner, data);
  ctx->winner = NULL;
}